

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O0

istream * PyreNet::operator>>(istream *is,Layer *l)

{
  undefined8 this;
  bool bVar1;
  activationType activation;
  Activation *pAVar2;
  reference p_00;
  Perceptron *p;
  iterator __end1;
  iterator __begin1;
  vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_> *__range1;
  int local_50 [2];
  int nodesSize;
  undefined1 local_40 [8];
  string activationString;
  ActivationFactory *activationFactory;
  Layer *l_local;
  istream *is_local;
  
  activationString.field_2._8_8_ = ActivationFactory::getInstance();
  std::__cxx11::string::string((string *)local_40);
  std::operator>>(is,(string *)local_40);
  this = activationString.field_2._8_8_;
  activation = ActivationFactory::fromString((string *)local_40);
  pAVar2 = ActivationFactory::getActivation((ActivationFactory *)this,activation);
  l->activation = pAVar2;
  std::istream::operator>>(is,local_50);
  Perceptron::Perceptron((Perceptron *)&__range1,0);
  std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::resize
            (&l->nodes,(long)local_50[0],(value_type *)&__range1);
  Perceptron::~Perceptron((Perceptron *)&__range1);
  __end1 = std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::begin(&l->nodes);
  p = (Perceptron *)
      std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::end(&l->nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<PyreNet::Perceptron_*,_std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>_>
                                *)&p);
    if (!bVar1) break;
    p_00 = __gnu_cxx::
           __normal_iterator<PyreNet::Perceptron_*,_std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>_>
           ::operator*(&__end1);
    operator>>(is,p_00);
    __gnu_cxx::
    __normal_iterator<PyreNet::Perceptron_*,_std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_40);
  return is;
}

Assistant:

std::istream& operator>>(std::istream& is, Layer &l) {
        ActivationFactory* activationFactory = ActivationFactory::getInstance();
        std::string activationString;
        is >> activationString;
        l.activation = activationFactory->getActivation(ActivationFactory::fromString(activationString));
        int nodesSize;
        is >> nodesSize;
        l.nodes.resize(nodesSize, Perceptron(0));
        for (Perceptron& p : l.nodes)
            is >> p;
        return is;
    }